

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::BufferTfOutputAttacher::setupContainer
          (BufferTfOutputAttacher *this,GLuint seed,GLuint tf)

{
  ContextWrapper *this_00;
  ostringstream *this_01;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VertexArray vao;
  Buffer posBuf;
  undefined1 local_1a8 [384];
  
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&posBuf,(this->super_OutputAttacher).super_ContextWrapper.m_ctx.m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,(this->super_OutputAttacher).super_ContextWrapper.m_ctx.m_renderCtx);
  iVar1 = (*((this->super_OutputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  initBuffer((Functions *)CONCAT44(extraout_var,iVar1),seed,0x88e4,
             posBuf.super_ObjectWrapper.m_object);
  ScaleProgram::setPos
            (this->m_program,posBuf.super_ObjectWrapper.m_object,vao.super_ObjectWrapper.m_object);
  this_00 = &(this->super_OutputAttacher).super_ContextWrapper;
  glu::CallLogWrapper::glBindTransformFeedback(&this_00->super_CallLogWrapper,0x8e22,tf);
  ScaleProgram::draw(this->m_program,vao.super_ObjectWrapper.m_object,-1.0,true,(Surface *)0x0);
  local_1a8._0_8_ = ((this->super_OutputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
  this_01 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_01);
  std::operator<<((ostream *)this_01,"// Drew an image with seed ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_01);
  std::operator<<((ostream *)this_01," with transform feedback to ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_01);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_01);
  glu::CallLogWrapper::glBindTransformFeedback(&this_00->super_CallLogWrapper,0x8e22,0);
  iVar1 = (*((this->super_OutputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  err = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                  ,0x188);
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&posBuf.super_ObjectWrapper);
  return;
}

Assistant:

void BufferTfOutputAttacher::setupContainer (GLuint seed, GLuint tf)
{
	Buffer		posBuf	(getRenderContext());
	VertexArray	vao		(getRenderContext());

	initBuffer(gl(), seed, GL_STATIC_DRAW, *posBuf);
	m_program.setPos(*posBuf, *vao);

	glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, tf);
	m_program.draw(*vao, -1.0, true, DE_NULL);
	log() << TestLog::Message
		  << "// Drew an image with seed " << seed << " with transform feedback to " << tf
		  << TestLog::EndMessage;
	glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
	GLU_CHECK_ERROR(gl().getError());
}